

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalGhsMultiGenerator::SetGeneratorToolset
          (cmGlobalGhsMultiGenerator *this,string *ts,cmMakefile *mf)

{
  bool bVar1;
  char *pcVar2;
  allocator<char> local_71;
  string message_1;
  string gbuild;
  string tsp;
  
  tsp._M_dataplus._M_p = (pointer)&tsp.field_2;
  tsp._M_string_length = 0;
  tsp.field_2._M_local_buf[0] = '\0';
  GetToolset(this,mf,&tsp,ts);
  if (tsp._M_string_length == 0) {
    bVar1 = false;
    goto LAB_001e02b0;
  }
  if (ts->_M_string_length == 0) {
    gbuild._M_dataplus._M_p = (pointer)&gbuild.field_2;
    gbuild._M_string_length = 0;
    gbuild.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&gbuild);
    std::__cxx11::string::append((string *)&gbuild);
    std::__cxx11::string::append((char *)&gbuild);
    cmSystemTools::Message(&gbuild,(char *)0x0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message_1,"CMAKE_GENERATOR_TOOLSET",&local_71);
    cmMakefile::AddCacheDefinition
              (mf,&message_1,tsp._M_dataplus._M_p,"Location of generator toolset.",INTERNAL,false);
    std::__cxx11::string::~string((string *)&message_1);
    std::__cxx11::string::~string((string *)&gbuild);
  }
  pcVar2 = "/";
  if (tsp._M_dataplus._M_p[tsp._M_string_length - 1] == '/') {
    pcVar2 = "";
  }
  std::operator+(&message_1,&tsp,pcVar2);
  std::operator+(&gbuild,&message_1,DEFAULT_BUILD_PROGRAM);
  std::__cxx11::string::~string((string *)&message_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message_1,"CMAKE_MAKE_PROGRAM",&local_71);
  pcVar2 = cmMakefile::GetDefinition(mf,&message_1);
  std::__cxx11::string::~string((string *)&message_1);
  if (pcVar2 == (char *)0x0) {
LAB_001e022d:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message_1,"CMAKE_MAKE_PROGRAM",&local_71);
    cmMakefile::AddCacheDefinition
              (mf,&message_1,gbuild._M_dataplus._M_p,"build program to use",INTERNAL,true);
    std::__cxx11::string::~string((string *)&message_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message_1,"CMAKE_SYSTEM_VERSION",&local_71);
    cmMakefile::AddDefinition(mf,&message_1,tsp._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&message_1);
    bVar1 = true;
  }
  else {
    bVar1 = std::operator!=(&gbuild,pcVar2);
    if (!bVar1) goto LAB_001e022d;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message_1,"toolset build tool: ",&local_71);
    std::__cxx11::string::append((string *)&message_1);
    std::__cxx11::string::append((char *)&message_1);
    std::__cxx11::string::append((char *)&message_1);
    std::__cxx11::string::append((char *)&message_1);
    cmSystemTools::Error(&message_1);
    std::__cxx11::string::~string((string *)&message_1);
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&gbuild);
LAB_001e02b0:
  std::__cxx11::string::~string((string *)&tsp);
  return bVar1;
}

Assistant:

bool cmGlobalGhsMultiGenerator::SetGeneratorToolset(std::string const& ts,
                                                    cmMakefile* mf)
{
  std::string tsp; /* toolset path */

  this->GetToolset(mf, tsp, ts);

  /* no toolset was found */
  if (tsp.empty()) {
    return false;
  }
  if (ts.empty()) {
    std::string message;
    message =
      "Green Hills MULTI: -T <toolset> not specified; defaulting to \"";
    message += tsp;
    message += "\"";
    cmSystemTools::Message(message);

    /* store the full toolset for later use
     * -- already done if -T<toolset> was specified
     */
    mf->AddCacheDefinition("CMAKE_GENERATOR_TOOLSET", tsp.c_str(),
                           "Location of generator toolset.",
                           cmStateEnums::INTERNAL);
  }

  /* set the build tool to use */
  std::string gbuild(tsp + ((tsp.back() == '/') ? "" : "/") +
                     DEFAULT_BUILD_PROGRAM);
  const char* prevTool = mf->GetDefinition("CMAKE_MAKE_PROGRAM");

  /* check if the toolset changed from last generate */
  if (prevTool != nullptr && (gbuild != prevTool)) {
    std::string message = "toolset build tool: ";
    message += gbuild;
    message += "\nDoes not match the previously used build tool: ";
    message += prevTool;
    message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
               "directory or choose a different binary directory.";
    cmSystemTools::Error(message);
    return false;
  }

  /* store the toolset that is being used for this build */
  mf->AddCacheDefinition("CMAKE_MAKE_PROGRAM", gbuild.c_str(),
                         "build program to use", cmStateEnums::INTERNAL, true);

  mf->AddDefinition("CMAKE_SYSTEM_VERSION", tsp.c_str());

  return true;
}